

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reassociation.cpp
# Opt level: O2

bool __thiscall mocker::detail::ReassociationImpl::operator()(ReassociationImpl *this)

{
  ReassociationImpl *__k;
  __shared_ptr<mocker::detail::ReassociationImpl::Node,_(__gnu_cxx::_Lock_policy)2> *this_00;
  mapped_type *pmVar1;
  ReassociationImpl *in_RSI;
  __node_base *p_Var2;
  __node_base *p_Var3;
  __node_base *p_Var4;
  vector<std::pair<bool,_std::shared_ptr<mocker::ir::Addr>_>,_std::allocator<std::pair<bool,_std::shared_ptr<mocker::ir::Addr>_>_>_>
  nodes;
  
  findRoots(this);
  p_Var2 = &(this->roots)._M_h._M_before_begin;
  p_Var3 = p_Var2;
  while (p_Var3 = p_Var3->_M_nxt, p_Var3 != (__node_base *)0x0) {
    std::__shared_ptr<mocker::ir::Addr,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<mocker::ir::Reg,void>
              ((__shared_ptr<mocker::ir::Addr,(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffb8
               ,(__shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2> *)(p_Var3 + 1));
    buildTrees((ReassociationImpl *)&nodes,(shared_ptr<mocker::ir::Addr> *)this,
               SUB81((__shared_ptr<mocker::ir::Addr,(__gnu_cxx::_Lock_policy)2> *)
                     &stack0xffffffffffffffb8,0));
    this_00 = &std::__detail::
               _Map_base<std::shared_ptr<mocker::ir::Reg>,_std::pair<const_std::shared_ptr<mocker::ir::Reg>,_std::shared_ptr<mocker::detail::ReassociationImpl::Node>_>,_std::allocator<std::pair<const_std::shared_ptr<mocker::ir::Reg>,_std::shared_ptr<mocker::detail::ReassociationImpl::Node>_>_>,_std::__detail::_Select1st,_mocker::ir::RegPtrEqual,_mocker::ir::RegPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::operator[]((_Map_base<std::shared_ptr<mocker::ir::Reg>,_std::pair<const_std::shared_ptr<mocker::ir::Reg>,_std::shared_ptr<mocker::detail::ReassociationImpl::Node>_>,_std::allocator<std::pair<const_std::shared_ptr<mocker::ir::Reg>,_std::shared_ptr<mocker::detail::ReassociationImpl::Node>_>_>,_std::__detail::_Select1st,_mocker::ir::RegPtrEqual,_mocker::ir::RegPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                             *)&this->trees,(key_type *)(p_Var3 + 1))->
               super___shared_ptr<mocker::detail::ReassociationImpl::Node,_(__gnu_cxx::_Lock_policy)2>
    ;
    in_RSI = (ReassociationImpl *)&nodes;
    std::__shared_ptr<mocker::detail::ReassociationImpl::Node,_(__gnu_cxx::_Lock_policy)2>::
    operator=(this_00,(__shared_ptr<mocker::detail::ReassociationImpl::Node,_(__gnu_cxx::_Lock_policy)2>
                       *)&nodes);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               &nodes.
                super__Vector_base<std::pair<bool,_std::shared_ptr<mocker::ir::Addr>_>,_std::allocator<std::pair<bool,_std::shared_ptr<mocker::ir::Addr>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffc0);
  }
  p_Var4 = &(this->trees)._M_h._M_before_begin;
  while (p_Var4 = p_Var4->_M_nxt, p_Var3 = p_Var2, p_Var4 != (__node_base *)0x0) {
    __k = (ReassociationImpl *)(p_Var4 + 1);
    flatten(&nodes,in_RSI,(shared_ptr<mocker::detail::ReassociationImpl::Node> *)(p_Var4 + 3));
    if ((ulong)(((long)nodes.
                       super__Vector_base<std::pair<bool,_std::shared_ptr<mocker::ir::Addr>_>,_std::allocator<std::pair<bool,_std::shared_ptr<mocker::ir::Addr>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                (long)nodes.
                      super__Vector_base<std::pair<bool,_std::shared_ptr<mocker::ir::Addr>_>,_std::allocator<std::pair<bool,_std::shared_ptr<mocker::ir::Addr>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start) / 0x18) < 10) {
      in_RSI = __k;
      std::
      _Hashtable<std::shared_ptr<mocker::ir::Reg>,std::shared_ptr<mocker::ir::Reg>,std::allocator<std::shared_ptr<mocker::ir::Reg>>,std::__detail::_Identity,mocker::ir::RegPtrEqual,mocker::ir::RegPtrHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
      ::_M_emplace<std::shared_ptr<mocker::ir::Reg>const&>
                ((_Hashtable<std::shared_ptr<mocker::ir::Reg>,std::shared_ptr<mocker::ir::Reg>,std::allocator<std::shared_ptr<mocker::ir::Reg>>,std::__detail::_Identity,mocker::ir::RegPtrEqual,mocker::ir::RegPtrHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                  *)&this->doNotRebuild,__k,
                 ((long)nodes.
                        super__Vector_base<std::pair<bool,_std::shared_ptr<mocker::ir::Addr>_>,_std::allocator<std::pair<bool,_std::shared_ptr<mocker::ir::Addr>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                 (long)nodes.
                       super__Vector_base<std::pair<bool,_std::shared_ptr<mocker::ir::Addr>_>,_std::allocator<std::pair<bool,_std::shared_ptr<mocker::ir::Addr>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start) % 0x18);
    }
    cancel((vector<std::pair<bool,_std::shared_ptr<mocker::ir::Addr>_>,_std::allocator<std::pair<bool,_std::shared_ptr<mocker::ir::Addr>_>_>_>
            *)&stack0xffffffffffffffb8,in_RSI,&nodes);
    pmVar1 = std::__detail::
             _Map_base<std::shared_ptr<mocker::ir::Reg>,_std::pair<const_std::shared_ptr<mocker::ir::Reg>,_std::vector<std::pair<bool,_std::shared_ptr<mocker::ir::Addr>_>,_std::allocator<std::pair<bool,_std::shared_ptr<mocker::ir::Addr>_>_>_>_>,_std::allocator<std::pair<const_std::shared_ptr<mocker::ir::Reg>,_std::vector<std::pair<bool,_std::shared_ptr<mocker::ir::Addr>_>,_std::allocator<std::pair<bool,_std::shared_ptr<mocker::ir::Addr>_>_>_>_>_>,_std::__detail::_Select1st,_mocker::ir::RegPtrEqual,_mocker::ir::RegPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<std::shared_ptr<mocker::ir::Reg>,_std::pair<const_std::shared_ptr<mocker::ir::Reg>,_std::vector<std::pair<bool,_std::shared_ptr<mocker::ir::Addr>_>,_std::allocator<std::pair<bool,_std::shared_ptr<mocker::ir::Addr>_>_>_>_>,_std::allocator<std::pair<const_std::shared_ptr<mocker::ir::Reg>,_std::vector<std::pair<bool,_std::shared_ptr<mocker::ir::Addr>_>,_std::allocator<std::pair<bool,_std::shared_ptr<mocker::ir::Addr>_>_>_>_>_>,_std::__detail::_Select1st,_mocker::ir::RegPtrEqual,_mocker::ir::RegPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)&this->flattenedNodes,(key_type *)__k);
    in_RSI = (ReassociationImpl *)&stack0xffffffffffffffb8;
    std::
    vector<std::pair<bool,_std::shared_ptr<mocker::ir::Addr>_>,_std::allocator<std::pair<bool,_std::shared_ptr<mocker::ir::Addr>_>_>_>
    ::_M_move_assign(pmVar1);
    std::
    vector<std::pair<bool,_std::shared_ptr<mocker::ir::Addr>_>,_std::allocator<std::pair<bool,_std::shared_ptr<mocker::ir::Addr>_>_>_>
    ::~vector((vector<std::pair<bool,_std::shared_ptr<mocker::ir::Addr>_>,_std::allocator<std::pair<bool,_std::shared_ptr<mocker::ir::Addr>_>_>_>
               *)&stack0xffffffffffffffb8);
    std::
    vector<std::pair<bool,_std::shared_ptr<mocker::ir::Addr>_>,_std::allocator<std::pair<bool,_std::shared_ptr<mocker::ir::Addr>_>_>_>
    ::~vector(&nodes);
  }
  while (p_Var3 = p_Var3->_M_nxt, p_Var3 != (__node_base *)0x0) {
    rankNodes(this,(shared_ptr<mocker::ir::Reg> *)(p_Var3 + 1));
  }
  while (p_Var2 = p_Var2->_M_nxt, p_Var2 != (__node_base *)0x0) {
    rebuild(this,(shared_ptr<mocker::ir::Reg> *)(p_Var2 + 1));
  }
  removeDeletedInsts(this->func);
  return false;
}

Assistant:

bool detail::ReassociationImpl::operator()() {
  findRoots();
  for (auto &root : roots) {
    trees[root] = buildTrees(root, true);
  }
  for (auto &kv : trees) {
    auto nodes = flatten(kv.second);
    if (nodes.size() < 10)
      doNotRebuild.emplace(kv.first);
    flattenedNodes[kv.first] = cancel(nodes);
  }

  for (auto &root : roots) {
    rankNodes(root);
  }

  for (auto &root : roots) {
    rebuild(root);
  }

  removeDeletedInsts(func);

  return false;
}